

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test::TestBody
          (SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test *this)

{
  bool bVar1;
  element_type *pile;
  element_type *__return_storage_ptr__;
  MockSpec<std::optional<solitaire::cards::Card>_()> *this_00;
  TypedExpectation<std::optional<solitaire::cards::Card>_()> *this_01;
  const_reference pvVar2;
  char *message;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  AssertHelper local_c8;
  Message local_c0;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_b8;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_a0;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ReturnAction<solitaire::cards::Card> local_70;
  Action<std::optional<solitaire::cards::Card>_()> local_60;
  WithoutMatchers local_39;
  MockSpec<std::optional<solitaire::cards::Card>_()> local_38 [2];
  InSequence local_11;
  SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test *pSStack_10;
  InSequence seq;
  SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test *this_local;
  
  pSStack_10 = this;
  testing::InSequence::InSequence(&local_11);
  pile = std::
         __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock);
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::StockPileMock>
            (&this->super_SolitaireEmptyHandTest,pile,
             &(this->super_SolitaireEmptyHandTest).snapshotMock);
  __return_storage_ptr__ =
       std::
       __shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock);
  local_38[0].function_mocker_ =
       (FunctionMocker<std::optional<solitaire::cards::Card>_()> *)
       piles::StockPileMock::gmock_tryPullOutCard
                 ((MockSpec<std::optional<solitaire::cards::Card>_()> *)__return_storage_ptr__,pile)
  ;
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::operator()
                      (local_38,&local_39,(void *)0x0);
  this_01 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::
            InternalExpectedAt(this_00,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,0x164,"*stockPileMock","tryPullOutCard()");
  pvVar2 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::back
                     ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                      (anonymous_namespace)::oneCard);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = pvVar2->value;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = pvVar2->suit;
  testing::Return<solitaire::cards::Card>
            ((testing *)&local_70,
             (Card)gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_60,(ReturnAction *)&local_70);
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::WillOnce
            (this_01,&local_60);
  testing::Action<std::optional<solitaire::cards::Card>_()>::~Action(&local_60);
  testing::internal::ReturnAction<solitaire::cards::Card>::~ReturnAction(&local_70);
  SolitaireEmptyHandTest::expectSavingSourcePileSnapshot
            (&this->super_SolitaireEmptyHandTest,&(this->super_SolitaireEmptyHandTest).snapshotMock)
  ;
  Solitaire::tryPullOutCardFromStockPile
            (&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_b8,(testing *)(anonymous_namespace)::oneCard,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_a0,(internal *)&local_b8,matcher);
  Solitaire::getCardsInHand(&(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_88,(char *)&local_a0,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_a0);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x168,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  testing::InSequence::~InSequence(&local_11);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardFromStockPile) {
    InSequence seq;
    expectSnapshotCreation(*stockPileMock, snapshotMock);
    EXPECT_CALL(*stockPileMock, tryPullOutCard()).WillOnce(Return(oneCard.back()));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardFromStockPile();
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(oneCard));
}